

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

socket_handle FIX::socket_createAcceptor(int port,bool reuse)

{
  int iVar1;
  int result;
  socklen_t socklen;
  sockaddr_in address;
  socket_handle socket;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  bool reuse_local;
  int port_local;
  
  address.sin_zero[7] = reuse;
  address.sin_zero._0_4_ = ::socket(2,1,0);
  if (address.sin_zero._0_4_ == -1) {
    _uStack_c = -1;
  }
  else {
    result._0_2_ = 2;
    result._2_2_ = htons((uint16_t)port);
    socklen = 0;
    if ((address.sin_zero[7] & 1) != 0) {
      socket_setsockopt(address.sin_zero._0_4_,2);
    }
    iVar1 = bind(address.sin_zero._0_4_,(sockaddr *)&result,0x10);
    if (iVar1 == -1) {
      _uStack_c = -1;
    }
    else {
      iVar1 = listen(address.sin_zero._0_4_,0x1000);
      if (iVar1 == -1) {
        _uStack_c = -1;
      }
      else {
        uStack_c = address.sin_zero[0];
        uStack_b = address.sin_zero[1];
        uStack_a = address.sin_zero[2];
        reuse_local = (bool)address.sin_zero[3];
      }
    }
  }
  return _uStack_c;
}

Assistant:

socket_handle socket_createAcceptor(int port, bool reuse) {
  socket_handle socket = ::socket(PF_INET, SOCK_STREAM, 0);
  if (socket == INVALID_SOCKET_HANDLE) {
    return INVALID_SOCKET_HANDLE;
  }

  sockaddr_in address;
  socklen_t socklen;

  address.sin_family = PF_INET;
  address.sin_port = htons(port);
  address.sin_addr.s_addr = INADDR_ANY;
  socklen = sizeof(address);
  if (reuse) {
    socket_setsockopt(socket, SO_REUSEADDR);
  }

  int result = bind(socket, reinterpret_cast<sockaddr *>(&address), socklen);

  if (result == BIND_SOCKET_ERROR) {
    return INVALID_SOCKET_HANDLE;
  }
  result = listen(socket, SOMAXCONN);
  if (result == LISTEN_SOCKET_ERROR) {
    return INVALID_SOCKET_HANDLE;
  }
  return socket;
}